

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

int FIX::IntTConvertor<int>::convert(string *value)

{
  bool bVar1;
  const_iterator str;
  const_iterator end;
  FieldConvertError *this;
  int local_14;
  string *psStack_10;
  int result;
  string *value_local;
  
  local_14 = 0;
  psStack_10 = value;
  str._M_current = (char *)std::__cxx11::string::begin();
  end._M_current = (char *)std::__cxx11::string::end();
  bVar1 = convert(str,end,&local_14);
  if (!bVar1) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,psStack_10);
    __cxa_throw(this,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  return local_14;
}

Assistant:

EXCEPT(FieldConvertError) {
    T result = 0;
    if (!convert(value.begin(), value.end(), result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }